

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O0

void __thiscall leveldb::IteratorWrapper::Prev(IteratorWrapper *this)

{
  IteratorWrapper *this_local;
  
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[7])();
    Update(this);
    return;
  }
  __assert_fail("iter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator_wrapper.h"
                ,0x39,"void leveldb::IteratorWrapper::Prev()");
}

Assistant:

void Prev() {
    assert(iter_);
    iter_->Prev();
    Update();
  }